

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O1

void Iso_StoStop(Iso_Sto_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *__ptr;
  
  pVVar1 = p->vPlaces;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vVisited;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->vRoots;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (p->pCounters != (int *)0x0) {
    free(p->pCounters);
    p->pCounters = (int *)0x0;
  }
  if (p->pData != (Iso_Dat_t *)0x0) {
    free(p->pData);
    p->pData = (Iso_Dat_t *)0x0;
  }
  if (p != (Iso_Sto_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Iso_StoStop( Iso_Sto_t * p )
{
    Vec_IntFree( p->vPlaces );
    Vec_IntFree( p->vVisited );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pCounters );
    ABC_FREE( p->pData );
    ABC_FREE( p );
}